

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::allocateBuckets(DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *this,uint Num)

{
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar1;
  bool bVar2;
  uint Num_local;
  DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *this_local;
  
  this->NumBuckets = Num;
  bVar2 = this->NumBuckets != 0;
  if (bVar2) {
    pDVar1 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)
             operator_new((ulong)this->NumBuckets << 4);
    this->Buckets = pDVar1;
  }
  else {
    this->Buckets = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
  }
  return bVar2;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT*>(operator new(sizeof(BucketT) * NumBuckets));
    return true;
  }